

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mainFrame.c
# Opt level: O0

void Abc_FrameDeallocate(Abc_Frame_t *p)

{
  int iVar1;
  void *__ptr;
  int local_1c;
  int i;
  char *pTemp;
  Abc_Frame_t *p_local;
  
  Rwt_ManGlobalStop();
  if (p->vAbcObjIds != (Vec_Int_t *)0x0) {
    Vec_IntFree(p->vAbcObjIds);
  }
  if (p->vCexVec != (Vec_Ptr_t *)0x0) {
    Vec_PtrFreeFree(p->vCexVec);
  }
  if (p->vPoEquivs != (Vec_Ptr_t *)0x0) {
    Vec_VecFree((Vec_Vec_t *)p->vPoEquivs);
  }
  if (p->vStatuses != (Vec_Int_t *)0x0) {
    Vec_IntFree(p->vStatuses);
  }
  if (p->pManDec != (void *)0x0) {
    Dec_ManStop((Dec_Man_t *)p->pManDec);
  }
  if (p->dd != (DdManager *)0x0) {
    Extra_StopManager(p->dd);
  }
  if (p->vStore != (Vec_Ptr_t *)0x0) {
    Vec_PtrFree(p->vStore);
  }
  if (p->pSave1 != (void *)0x0) {
    Aig_ManStop((Aig_Man_t *)p->pSave1);
  }
  if (p->pSave2 != (void *)0x0) {
    Aig_ManStop((Aig_Man_t *)p->pSave2);
  }
  if (p->pSave3 != (void *)0x0) {
    Aig_ManStop((Aig_Man_t *)p->pSave3);
  }
  if (p->pSave4 != (void *)0x0) {
    Aig_ManStop((Aig_Man_t *)p->pSave4);
  }
  if (p->pManDsd != (void *)0x0) {
    If_DsdManFree((If_DsdMan_t *)p->pManDsd,0);
  }
  if (p->pManDsd2 != (void *)0x0) {
    If_DsdManFree((If_DsdMan_t *)p->pManDsd2,0);
  }
  if (p->pNtkBackup != (Abc_Ntk_t *)0x0) {
    Abc_NtkDelete(p->pNtkBackup);
  }
  if (p->vPlugInComBinPairs != (Vec_Ptr_t *)0x0) {
    for (local_1c = 0; iVar1 = Vec_PtrSize(p->vPlugInComBinPairs), local_1c < iVar1;
        local_1c = local_1c + 1) {
      __ptr = Vec_PtrEntry(p->vPlugInComBinPairs,local_1c);
      if (__ptr != (void *)0x0) {
        free(__ptr);
      }
    }
    Vec_PtrFree(p->vPlugInComBinPairs);
  }
  Vec_IntFreeP(&p->vIndFlops);
  Vec_PtrFreeP(&p->vLTLProperties_global);
  if (p->vSignalNames != (Vec_Ptr_t *)0x0) {
    Vec_PtrFreeFree(p->vSignalNames);
  }
  Abc_FrameDeleteAllNetworks(p);
  if (p->pDrivingCell != (char *)0x0) {
    free(p->pDrivingCell);
    p->pDrivingCell = (char *)0x0;
  }
  if (p->pCex2 != (Abc_Cex_t *)0x0) {
    free(p->pCex2);
    p->pCex2 = (Abc_Cex_t *)0x0;
  }
  if (p->pCex != (Abc_Cex_t *)0x0) {
    free(p->pCex);
    p->pCex = (Abc_Cex_t *)0x0;
  }
  Vec_IntFreeP(&p->pAbcWlcInv);
  Abc_NamDeref(s_GlobalFrame->pJsonStrs);
  Vec_WecFreeP(&s_GlobalFrame->vJsonObjs);
  Ndr_Delete(s_GlobalFrame->pNdr);
  if (s_GlobalFrame->pNdrArray != (int *)0x0) {
    free(s_GlobalFrame->pNdrArray);
    s_GlobalFrame->pNdrArray = (int *)0x0;
  }
  Gia_ManStopP(&p->pGiaMiniAig);
  Gia_ManStopP(&p->pGiaMiniLut);
  Vec_IntFreeP(&p->vCopyMiniAig);
  Vec_IntFreeP(&p->vCopyMiniLut);
  if (p->pArray != (int *)0x0) {
    free(p->pArray);
    p->pArray = (int *)0x0;
  }
  if (p->pBoxes != (int *)0x0) {
    free(p->pBoxes);
    p->pBoxes = (int *)0x0;
  }
  if (p != (Abc_Frame_t *)0x0) {
    free(p);
  }
  s_GlobalFrame = (Abc_Frame_t *)0x0;
  return;
}

Assistant:

void Abc_FrameDeallocate( Abc_Frame_t * p )
{
    extern void Rwt_ManGlobalStop();
    extern void undefine_cube_size();
//    extern void Ivy_TruthManStop();
//    Abc_HManStop();
//    undefine_cube_size();
    Rwt_ManGlobalStop();
//    Ivy_TruthManStop();
    if ( p->vAbcObjIds)  Vec_IntFree( p->vAbcObjIds );
    if ( p->vCexVec   )  Vec_PtrFreeFree( p->vCexVec );
    if ( p->vPoEquivs )  Vec_VecFree( (Vec_Vec_t *)p->vPoEquivs );
    if ( p->vStatuses )  Vec_IntFree( p->vStatuses );
    if ( p->pManDec   )  Dec_ManStop( (Dec_Man_t *)p->pManDec );
#ifdef ABC_USE_CUDD
    if ( p->dd        )  Extra_StopManager( p->dd );
#endif
    if ( p->vStore    )  Vec_PtrFree( p->vStore );
    if ( p->pSave1    )  Aig_ManStop( (Aig_Man_t *)p->pSave1 );
    if ( p->pSave2    )  Aig_ManStop( (Aig_Man_t *)p->pSave2 );
    if ( p->pSave3    )  Aig_ManStop( (Aig_Man_t *)p->pSave3 );
    if ( p->pSave4    )  Aig_ManStop( (Aig_Man_t *)p->pSave4 );
    if ( p->pManDsd   )  If_DsdManFree( (If_DsdMan_t *)p->pManDsd, 0 );
    if ( p->pManDsd2  )  If_DsdManFree( (If_DsdMan_t *)p->pManDsd2, 0 );
    if ( p->pNtkBackup)  Abc_NtkDelete( p->pNtkBackup );
    if ( p->vPlugInComBinPairs ) 
    {
        char * pTemp;
        int i;
        Vec_PtrForEachEntry( char *, p->vPlugInComBinPairs, pTemp, i )
            ABC_FREE( pTemp );
        Vec_PtrFree( p->vPlugInComBinPairs );
    }
    Vec_IntFreeP( &p->vIndFlops );
    Vec_PtrFreeP( &p->vLTLProperties_global );
    if ( p->vSignalNames )
    Vec_PtrFreeFree( p->vSignalNames );
    Abc_FrameDeleteAllNetworks( p );
    ABC_FREE( p->pDrivingCell );
    ABC_FREE( p->pCex2 );
    ABC_FREE( p->pCex );
    Vec_IntFreeP( &p->pAbcWlcInv );
    Abc_NamDeref( s_GlobalFrame->pJsonStrs );
    Vec_WecFreeP( &s_GlobalFrame->vJsonObjs );  
    Ndr_Delete( s_GlobalFrame->pNdr );
    ABC_FREE( s_GlobalFrame->pNdrArray );

    Gia_ManStopP( &p->pGiaMiniAig );
    Gia_ManStopP( &p->pGiaMiniLut );
    Vec_IntFreeP( &p->vCopyMiniAig );
    Vec_IntFreeP( &p->vCopyMiniLut );
    ABC_FREE( p->pArray );
    ABC_FREE( p->pBoxes );
    

    ABC_FREE( p );
    s_GlobalFrame = NULL;
}